

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O1

int __thiscall kj::WaitScope::poll(WaitScope *this,pollfd *__fds,nfds_t __nfds,int __timeout)

{
  FiberPool *this_00;
  bool bVar1;
  int __timeout_00;
  nfds_t __nfds_00;
  long *in_FS_OFFSET;
  FunctionParam<void_()> func;
  uint turnCount;
  uint maxTurnCount_local;
  DebugComparison<kj::EventLoop_*,_kj::EventLoop_*&> _kjCondition;
  EventLoop **ppEVar2;
  
  maxTurnCount_local = (uint)__fds;
  _kjCondition.left = this->loop;
  _kjCondition.right = (EventLoop **)(*in_FS_OFFSET + -0x28);
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.result = _kjCondition.left == (EventLoop *)in_FS_OFFSET[-5];
  _kjCondition.op.content.size_ = 5;
  if (!_kjCondition.result) {
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<kj::EventLoop*,kj::EventLoop*&>&,char_const(&)[37]>
              ((Fault *)&turnCount,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async.c++"
               ,0x782,FAILED,"&loop == threadLocalEventLoop",
               "_kjCondition,\"WaitScope not valid for this thread.\"",&_kjCondition,
               (char (*) [37])"WaitScope not valid for this thread.");
    kj::_::Debug::Fault::fatal((Fault *)&turnCount);
  }
  bVar1 = (_kjCondition.left)->running;
  turnCount = CONCAT31(turnCount._1_3_,bVar1) ^ 1;
  if (bVar1 != false) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[51]>
              ((Fault *)&_kjCondition,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async.c++"
               ,0x783,FAILED,"!loop.running",
               "_kjCondition,\"poll() is not allowed from within event callbacks.\"",
               (DebugExpression<bool> *)&turnCount,
               (char (*) [51])"poll() is not allowed from within event callbacks.");
    kj::_::Debug::Fault::fatal((Fault *)&_kjCondition);
  }
  (_kjCondition.left)->running = true;
  turnCount = 0;
  _kjCondition.right = (EventLoop **)&maxTurnCount_local;
  this_00 = (this->runningStacksPool).ptr;
  _kjCondition.op.content.ptr = (char *)this;
  if (this_00 == (FiberPool *)0x0) {
    ppEVar2 = (EventLoop **)CONCAT71(0x4a82,bVar1);
    _kjCondition.left = (EventLoop *)&turnCount;
    if (maxTurnCount_local != 0) {
      do {
        __timeout_00 = (int)ppEVar2;
        bVar1 = EventLoop::turn(this->loop);
        if (bVar1) {
          *(int *)&((_kjCondition.left)->port).ptr = *(int *)&((_kjCondition.left)->port).ptr + 1;
        }
        else {
          EventLoop::poll(this->loop,__fds,__nfds_00,__timeout_00);
          if (this->loop->head == (Event *)0x0) break;
        }
        ppEVar2 = _kjCondition.right;
      } while (*(uint *)&((_kjCondition.left)->port).ptr < *(uint *)_kjCondition.right);
    }
  }
  else {
    func.space._8_8_ = &_kjCondition;
    func.space._0_8_ = &PTR_operator___006454e0;
    _kjCondition.left = (EventLoop *)&turnCount;
    FiberPool::runSynchronously(this_00,func);
  }
  this->loop->running = false;
  return turnCount;
}

Assistant:

uint WaitScope::poll(uint maxTurnCount) {
  KJ_REQUIRE(&loop == threadLocalEventLoop, "WaitScope not valid for this thread.");
  KJ_REQUIRE(!loop.running, "poll() is not allowed from within event callbacks.");

  loop.running = true;
  KJ_DEFER(loop.running = false);

  uint turnCount = 0;
  runOnStackPool([&]() {
    while (turnCount < maxTurnCount) {
      if (loop.turn()) {
        ++turnCount;
      } else {
        // No events in the queue.  Poll for I/O.
        loop.poll();

        if (!loop.isRunnable()) {
          // Still no events in the queue. We're done.
          return;
        }
      }
    }
  });
  return turnCount;
}